

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_4153d9::VectorType::printLeft(VectorType *this,OutputStream *S)

{
  void *pvVar1;
  void *__src;
  Node *pNVar2;
  long *__src_00;
  size_t Size;
  size_t sVar3;
  
  if (this->IsPixel == true) {
    OutputStream::grow(S,0xd);
    builtin_strncpy(S->Buffer + S->CurrentPosition,"pixel vector[",0xd);
    S->CurrentPosition = S->CurrentPosition + 0xd;
    pvVar1 = (this->Dimension).Second;
    if ((pvVar1 == (void *)0x0) || (__src = (this->Dimension).First, __src == (void *)0x0)) {
      __assert_fail("isString()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Demangle/ItaniumDemangle.cpp"
                    ,0x22f,"StringView (anonymous namespace)::NodeOrString::asString() const");
    }
    sVar3 = (long)pvVar1 - (long)__src;
    if (sVar3 != 0) {
      OutputStream::grow(S,sVar3);
      memmove(S->Buffer + S->CurrentPosition,__src,sVar3);
      S->CurrentPosition = S->CurrentPosition + sVar3;
    }
  }
  else {
    pNVar2 = this->BaseType;
    (*pNVar2->_vptr_Node[4])(pNVar2,S);
    if (pNVar2->RHSComponentCache != No) {
      (*pNVar2->_vptr_Node[5])(pNVar2,S);
    }
    OutputStream::grow(S,8);
    builtin_strncpy(S->Buffer + S->CurrentPosition," vector[",8);
    S->CurrentPosition = S->CurrentPosition + 8;
    __src_00 = (long *)(this->Dimension).First;
    pvVar1 = (this->Dimension).Second;
    if (pvVar1 == (void *)0x0 && __src_00 != (long *)0x0) {
      (**(code **)(*__src_00 + 0x20))(__src_00,S);
      if (*(char *)((long)__src_00 + 9) != '\x01') {
        (**(code **)(*__src_00 + 0x28))(__src_00,S);
      }
    }
    else {
      sVar3 = (long)pvVar1 - (long)__src_00;
      if ((sVar3 != 0 && pvVar1 != (void *)0x0) && __src_00 != (long *)0x0) {
        OutputStream::grow(S,sVar3);
        memmove(S->Buffer + S->CurrentPosition,__src_00,sVar3);
        S->CurrentPosition = S->CurrentPosition + sVar3;
      }
    }
  }
  OutputStream::grow(S,1);
  S->Buffer[S->CurrentPosition] = ']';
  S->CurrentPosition = S->CurrentPosition + 1;
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    if (IsPixel) {
      S += "pixel vector[";
      S += Dimension.asString();
      S += "]";
    } else {
      BaseType->print(S);
      S += " vector[";
      if (Dimension.isNode())
        Dimension.asNode()->print(S);
      else if (Dimension.isString())
        S += Dimension.asString();
      S += "]";
    }
  }